

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall
t_rs_generator::render_type_sync_read
          (t_rs_generator *this,string *type_var,t_type *ttype,bool is_boxed)

{
  t_type *type_var_00;
  bool is_boxed_00;
  uint uVar1;
  t_base tVar2;
  int iVar3;
  undefined8 *puVar4;
  t_type *ttype_00;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  undefined4 extraout_var;
  string local_1f0;
  byte local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  undefined1 local_168 [8];
  string read_call;
  t_typedef *ttypedef;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_50;
  t_map *local_30;
  t_base_type *tbase_type;
  t_map *ptStack_20;
  bool is_boxed_local;
  t_type *ttype_local;
  string *type_var_local;
  t_rs_generator *this_local;
  
  tbase_type._7_1_ = is_boxed;
  ptStack_20 = (t_map *)ttype;
  ttype_local = (t_type *)type_var;
  type_var_local = (string *)this;
  uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[5])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[9])();
    type_var_00 = ttype_local;
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[10])();
      if ((((uVar1 & 1) == 0) &&
          (uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xb])(),
          (uVar1 & 1) == 0)) &&
         (uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xc])(),
         (uVar1 & 1) == 0)) {
        uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])();
        if ((uVar1 & 1) == 0) {
          uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])();
          if ((uVar1 & 1) == 0) {
            uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])();
            if ((uVar1 & 1) == 0) goto switchD_004573b4_default;
            render_list_sync_read(this,(t_list *)ptStack_20,(string *)ttype_local);
          }
          else {
            render_set_sync_read(this,(t_set *)ptStack_20,(string *)ttype_local);
          }
        }
        else {
          render_map_sync_read(this,ptStack_20,(string *)ttype_local);
        }
      }
      else {
        to_rust_type_abi_cxx11_(&local_188,this,(t_type *)ptStack_20);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168,&local_188,"::read_from_in_protocol(i_prot)?");
        std::__cxx11::string::~string((string *)&local_188);
        local_1c9 = 0;
        if ((tbase_type._7_1_ & 1) == 0) {
          std::__cxx11::string::string((string *)&local_1a8,(string *)local_168);
        }
        else {
          std::operator+(&local_1c8,"Box::new(",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_168);
          local_1c9 = 1;
          std::operator+(&local_1a8,&local_1c8,")");
        }
        std::__cxx11::string::operator=((string *)local_168,(string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        if ((local_1c9 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_1c8);
        }
        t_generator::indent_abi_cxx11_(&local_1f0,&this->super_t_generator);
        poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_1f0);
        poVar5 = std::operator<<(poVar5,"let ");
        poVar5 = std::operator<<(poVar5,(string *)ttype_local);
        poVar5 = std::operator<<(poVar5," = ");
        poVar5 = std::operator<<(poVar5,(string *)local_168);
        poVar5 = std::operator<<(poVar5,";");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)local_168);
      }
    }
    else {
      read_call.field_2._8_8_ = ptStack_20;
      ttype_00 = t_typedef::get_type((t_typedef *)ptStack_20);
      is_boxed_00 = t_typedef::is_forward_typedef((t_typedef *)read_call.field_2._8_8_);
      render_type_sync_read(this,(string *)type_var_00,ttype_00,is_boxed_00);
    }
  }
  else {
    local_30 = ptStack_20;
    tVar2 = t_base_type::get_base((t_base_type *)ptStack_20);
    switch(tVar2) {
    case TYPE_VOID:
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "cannot read field of type TYPE_VOID from input protocol";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    case TYPE_STRING:
      uVar1 = (*(local_30->super_t_container).super_t_type.super_t_doc._vptr_t_doc[7])();
      if ((uVar1 & 1) == 0) {
        t_generator::indent_abi_cxx11_(&local_80,&this->super_t_generator);
        poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_80);
        poVar5 = std::operator<<(poVar5,"let ");
        poVar5 = std::operator<<(poVar5,(string *)ttype_local);
        poVar5 = std::operator<<(poVar5," = i_prot.read_string()?;");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_80);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_50,&this->super_t_generator);
        poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_50);
        poVar5 = std::operator<<(poVar5,"let ");
        poVar5 = std::operator<<(poVar5,(string *)ttype_local);
        poVar5 = std::operator<<(poVar5," = i_prot.read_bytes()?;");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_50);
      }
      break;
    case TYPE_BOOL:
      t_generator::indent_abi_cxx11_(&local_a0,&this->super_t_generator);
      poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_a0);
      poVar5 = std::operator<<(poVar5,"let ");
      poVar5 = std::operator<<(poVar5,(string *)ttype_local);
      poVar5 = std::operator<<(poVar5," = i_prot.read_bool()?;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_a0);
      break;
    case TYPE_I8:
      t_generator::indent_abi_cxx11_(&local_c0,&this->super_t_generator);
      poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_c0);
      poVar5 = std::operator<<(poVar5,"let ");
      poVar5 = std::operator<<(poVar5,(string *)ttype_local);
      poVar5 = std::operator<<(poVar5," = i_prot.read_i8()?;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_c0);
      break;
    case TYPE_I16:
      t_generator::indent_abi_cxx11_(&local_e0,&this->super_t_generator);
      poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_e0);
      poVar5 = std::operator<<(poVar5,"let ");
      poVar5 = std::operator<<(poVar5,(string *)ttype_local);
      poVar5 = std::operator<<(poVar5," = i_prot.read_i16()?;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_e0);
      break;
    case TYPE_I32:
      t_generator::indent_abi_cxx11_(&local_100,&this->super_t_generator);
      poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_100);
      poVar5 = std::operator<<(poVar5,"let ");
      poVar5 = std::operator<<(poVar5,(string *)ttype_local);
      poVar5 = std::operator<<(poVar5," = i_prot.read_i32()?;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_100);
      break;
    case TYPE_I64:
      t_generator::indent_abi_cxx11_(&local_120,&this->super_t_generator);
      poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_120);
      poVar5 = std::operator<<(poVar5,"let ");
      poVar5 = std::operator<<(poVar5,(string *)ttype_local);
      poVar5 = std::operator<<(poVar5," = i_prot.read_i64()?;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_120);
      break;
    case TYPE_DOUBLE:
      t_generator::indent_abi_cxx11_((string *)&ttypedef,&this->super_t_generator);
      poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&ttypedef);
      poVar5 = std::operator<<(poVar5,"let ");
      poVar5 = std::operator<<(poVar5,(string *)ttype_local);
      poVar5 = std::operator<<(poVar5," = OrderedFloat::from(i_prot.read_double()?);");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&ttypedef);
      break;
    default:
switchD_004573b4_default:
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      iVar3 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[3])();
      std::operator+(__return_storage_ptr__,"cannot read unsupported type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar3));
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  return;
}

Assistant:

void t_rs_generator::render_type_sync_read(const string &type_var, t_type *ttype, bool is_boxed) {
  if (ttype->is_base_type()) {
    t_base_type* tbase_type = (t_base_type*)ttype;
    switch (tbase_type->get_base()) {
    case t_base_type::TYPE_VOID:
      throw "cannot read field of type TYPE_VOID from input protocol";
    case t_base_type::TYPE_STRING:
      if (tbase_type->is_binary()) {
        f_gen_ << indent() << "let " << type_var << " = i_prot.read_bytes()?;" << endl;
      } else {
        f_gen_ << indent() << "let " << type_var << " = i_prot.read_string()?;" << endl;
      }
      return;
    case t_base_type::TYPE_BOOL:
      f_gen_ << indent() << "let " << type_var << " = i_prot.read_bool()?;" << endl;
      return;
    case t_base_type::TYPE_I8:
      f_gen_ << indent() << "let " << type_var << " = i_prot.read_i8()?;" << endl;
      return;
    case t_base_type::TYPE_I16:
      f_gen_ << indent() << "let " << type_var << " = i_prot.read_i16()?;" << endl;
      return;
    case t_base_type::TYPE_I32:
      f_gen_ << indent() << "let " << type_var << " = i_prot.read_i32()?;" << endl;
      return;
    case t_base_type::TYPE_I64:
      f_gen_ << indent() << "let " << type_var << " = i_prot.read_i64()?;" << endl;
      return;
    case t_base_type::TYPE_DOUBLE:
      f_gen_ << indent() << "let " << type_var << " = OrderedFloat::from(i_prot.read_double()?);" << endl;
      return;
    }
  } else if (ttype->is_typedef()) {
    // FIXME: not a fan of separate `is_boxed` parameter
    // This is problematic because it's an optional parameter, and only comes
    // into play once. The core issue is that I lose an important piece of type
    // information (whether the type is a fwd ref) by unwrapping the typedef'd
    // type and making the recursive call using it. I can't modify or wrap the
    // generated string after the fact because it's written directly into the file,
    // so I have to pass this parameter along. Going with this approach because it
    // seems like the lowest-cost option to easily support recursive types.
    t_typedef* ttypedef = (t_typedef*)ttype;
    render_type_sync_read(type_var, ttypedef->get_type(), ttypedef->is_forward_typedef());
    return;
  } else if (ttype->is_enum() || ttype->is_struct() || ttype->is_xception()) {
    string read_call(to_rust_type(ttype) + "::read_from_in_protocol(i_prot)?");
    read_call = is_boxed ? "Box::new(" + read_call + ")" : read_call;
    f_gen_
      << indent()
      << "let " << type_var << " = " <<  read_call << ";"
      << endl;
    return;
  } else if (ttype->is_map()) {
    render_map_sync_read((t_map *) ttype, type_var);
    return;
  } else if (ttype->is_set()) {
    render_set_sync_read((t_set *) ttype, type_var);
    return;
  } else if (ttype->is_list()) {
    render_list_sync_read((t_list *) ttype, type_var);
    return;
  }

  throw "cannot read unsupported type " + ttype->get_name();
}